

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void image_manipulation::bilinear_resize
               (clip_image_u8 *src,clip_image_u8 *dst,int target_width,int target_height)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  reference pvVar7;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float e;
  float fVar11;
  float bottom;
  float top;
  int c;
  float y_lerp;
  float x_lerp;
  int y_floor;
  int x_floor;
  float py;
  float px;
  int x;
  int y;
  float y_ratio;
  float x_ratio;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  
  *in_RSI = in_EDX;
  in_RSI[1] = in_ECX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar2 = *in_RDI;
  iVar3 = in_RDI[1];
  for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
      fVar8 = ((float)(iVar2 + -1) / (float)in_EDX) * (float)local_28;
      fVar9 = ((float)(iVar3 + -1) / (float)in_ECX) * (float)local_24;
      iVar4 = (int)fVar8;
      iVar5 = (int)fVar9;
      fVar8 = fVar8 - (float)iVar4;
      fVar11 = (float)iVar5;
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                            (long)((iVar5 * *in_RDI + iVar4) * 3 + local_44));
        bVar1 = *pbVar6;
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                            (long)(local_44 + 3 + (iVar4 + iVar5 * *in_RDI) * 3));
        fVar10 = lerp((float)bVar1,(float)*pbVar6,fVar8);
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                            (long)(((iVar5 + 1) * *in_RDI + iVar4) * 3 + local_44));
        bVar1 = *pbVar6;
        pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 2),
                            (long)(local_44 + 3 + (iVar4 + (iVar5 + 1) * *in_RDI) * 3));
        e = lerp((float)bVar1,(float)*pbVar6,fVar8);
        fVar10 = lerp(fVar10,e,fVar9 - fVar11);
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RSI + 2),
                            (long)((local_24 * in_EDX + local_28) * 3 + local_44));
        *pvVar7 = (value_type)(int)fVar10;
      }
    }
  }
  return;
}

Assistant:

static void bilinear_resize(const clip_image_u8& src, clip_image_u8& dst, int target_width, int target_height) {
        dst.nx = target_width;
        dst.ny = target_height;
        dst.buf.resize(3 * target_width * target_height);

        float x_ratio = static_cast<float>(src.nx - 1) / target_width;
        float y_ratio = static_cast<float>(src.ny - 1) / target_height;

        for (int y = 0; y < target_height; y++) {
            for (int x = 0; x < target_width; x++) {
                float px = x_ratio * x;
                float py = y_ratio * y;
                int x_floor = static_cast<int>(px);
                int y_floor = static_cast<int>(py);
                float x_lerp = px - x_floor;
                float y_lerp = py - y_floor;

                for (int c = 0; c < 3; c++) {
                    float top = lerp(
                        static_cast<float>(src.buf[3 * (y_floor * src.nx + x_floor) + c]),
                        static_cast<float>(src.buf[3 * (y_floor * src.nx + (x_floor + 1)) + c]),
                        x_lerp
                    );
                    float bottom = lerp(
                        static_cast<float>(src.buf[3 * ((y_floor + 1) * src.nx + x_floor) + c]),
                        static_cast<float>(src.buf[3 * ((y_floor + 1) * src.nx + (x_floor + 1)) + c]),
                        x_lerp
                    );
                    dst.buf[3 * (y * target_width + x) + c] = static_cast<uint8_t>(lerp(top, bottom, y_lerp));
                }
            }
        }
    }